

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O1

long gimage::cmp<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *diff,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *im1,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *im2,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *tol)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uchar uVar7;
  int iVar8;
  
  lVar2 = -1;
  if (((im1->width == im2->width) && (im1->height == im2->height)) && (im1->depth == im2->depth)) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (diff,im1->width,im1->height,(long)im1->depth);
    if (im1->depth < 1) {
      lVar2 = 0;
    }
    else {
      lVar3 = 0;
      lVar2 = 0;
      uVar4 = 0;
      do {
        puVar1 = (tol->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (lVar3 < *(int *)&(tol->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (int)puVar1) {
          uVar4 = (uint)puVar1[lVar3];
        }
        if (0 < im1->height) {
          lVar5 = 0;
          do {
            if (0 < im1->width) {
              lVar6 = 0;
              do {
                iVar8 = (uint)im1->img[lVar3][lVar5][lVar6] - (uint)im2->img[lVar3][lVar5][lVar6];
                lVar2 = lVar2 + (ulong)((int)uVar4 < iVar8);
                if (0xfe < iVar8) {
                  iVar8 = 0xff;
                }
                uVar7 = (uchar)iVar8;
                if (iVar8 < 1) {
                  uVar7 = '\0';
                }
                diff->img[lVar3][lVar5][lVar6] = uVar7;
                lVar6 = lVar6 + 1;
              } while (lVar6 < im1->width);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < im1->height);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < im1->depth);
    }
  }
  return lVar2;
}

Assistant:

long cmp(Image<T> &diff, const Image<T> &im1,
                           const Image<T> &im2, const std::vector<T> &tol)
{
  if (im1.getWidth() != im2.getWidth() || im1.getHeight() != im2.getHeight() ||
      im1.getDepth() != im2.getDepth())
  {
    return -1;
  }

  diff.setSize(im1.getWidth(), im1.getHeight(), im1.getDepth());

  long ret=0;
  typename Image<T>::work_t t=0;

  for (int d=0; d<im1.getDepth(); d++)
  {
    if (d < static_cast<int>(tol.size()))
    {
      t=tol[d];
    }

    for (long k=0; k<im1.getHeight(); k++)
    {
      for (long i=0; i<im1.getWidth(); i++)
      {
        typename Image<T>::work_t v1=im1.getW(i, k, d);
        typename Image<T>::work_t v2=im2.getW(i, k, d);
        typename Image<T>::work_t v;

        if (im1.isValidW(v1) && im2.isValidW(v2))
        {
          v=v1-v2;
        }
        else if (!im1.isValidW(v1) && !im2.isValidW(v2))
        {
          v=0;
        }
        else
        {
          v=Image<T>::ptraits::invalid();
        }

//        if (v < 0)
//        {
//          v=-v;
//        }

        if (v > t)
        {
          ret++;
        }

        diff.setLimited(i, k, d, v);
      }
    }
  }

  return ret;
}